

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree(TaprootScriptTree *this,TaprootScriptTree *tap_tree)

{
  byte bVar1;
  CfdException *this_00;
  long lVar2;
  string local_50;
  
  TapBranch::TapBranch(&this->super_TapBranch,&tap_tree->super_TapBranch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = (tap_tree->super_TapBranch).leaf_version_;
  lVar2 = 0;
  do {
    if (*(uint *)((long)TaprootUtil::IsValidLeafVersion::kValidLeafVersions + lVar2) == (uint)bVar1)
    goto LAB_0035e758;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x24);
  if (((bVar1 & 1) != 0) || (0x3e < (byte)(bVar1 + 0x40))) {
    local_50._M_dataplus._M_p = "cfdcore_taproot.cpp";
    local_50._M_string_length._0_4_ = 0x1ee;
    local_50.field_2._M_allocated_capacity = (long)"CfdInitializeTaprootScriptTree" + 0xd;
    logger::log<unsigned_char_const&>
              ((CfdSourceLocation *)&local_50,kCfdLogLevelWarning,"Unsupported leaf version. [{}]",
               &(tap_tree->super_TapBranch).leaf_version_);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unsupported leaf version.","");
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
LAB_0035e758:
  (this->super_TapBranch).has_leaf_ = (tap_tree->super_TapBranch).has_leaf_;
  (this->super_TapBranch).leaf_version_ = bVar1;
  Script::operator=(&(this->super_TapBranch).script_,&(tap_tree->super_TapBranch).script_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(this->super_TapBranch).root_commitment_,
             &(tap_tree->super_TapBranch).root_commitment_.data_);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
            (&(this->super_TapBranch).branch_list_,&(tap_tree->super_TapBranch).branch_list_);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
            (&this->nodes_,&tap_tree->nodes_);
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(const TaprootScriptTree& tap_tree)
    : TapBranch(tap_tree) {
  if (!TaprootUtil::IsValidLeafVersion(tap_tree.leaf_version_)) {
    warn(
        CFD_LOG_SOURCE, "Unsupported leaf version. [{}]",
        tap_tree.leaf_version_);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
  has_leaf_ = tap_tree.has_leaf_;
  leaf_version_ = tap_tree.leaf_version_;
  script_ = tap_tree.script_;
  root_commitment_ = tap_tree.root_commitment_;
  branch_list_ = tap_tree.branch_list_;
  nodes_ = tap_tree.nodes_;
}